

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_compute_branch1(DisasContext_conflict6 *ctx,uint32_t op,int32_t cc,int32_t offset)

{
  TCGContext_conflict6 *s;
  target_ulong tVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *ts;
  TCGv_i32 arg1;
  TCGv_i32 pTVar3;
  int32_t iVar4;
  uintptr_t o;
  TCGv_i32 ret;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)s);
  if ((((uint)ctx->insn_flags >> 0xd & 1) != 0) && ((ctx->hflags & 0x87f800) != 0)) {
LAB_009b193b:
    generate_exception_err(ctx,0x14,0);
    goto LAB_009b1dab;
  }
  if ((ctx->insn_flags & 0x28) == 0 && cc != 0) {
    generate_exception_err(ctx,0x14,0);
  }
  tVar1 = (ctx->base).pc_next;
  if ((int)op < 0x45200000) {
    if ((int)op < 0x45020000) {
      if (op == 0x45000000) {
        iVar4 = 0x17;
        if (cc != 0) {
          iVar4 = cc + 0x18;
        }
        tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
        tcg_gen_op2_mips64el(s,INDEX_op_not_i32,(TCGArg)a1,(TCGArg)a1);
      }
      else {
        if (op != 0x45010000) goto LAB_009b193b;
        iVar4 = 0x17;
        if (cc != 0) {
          iVar4 = cc + 0x18;
        }
        tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
      }
      goto LAB_009b1d5f;
    }
    if (op == 0x45020000) {
      iVar4 = 0x17;
      if (cc != 0) {
        iVar4 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
      tcg_gen_op2_mips64el(s,INDEX_op_not_i32,(TCGArg)a1,(TCGArg)a1);
    }
    else {
      if (op != 0x45030000) goto LAB_009b193b;
      iVar4 = 0x17;
      if (cc != 0) {
        iVar4 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
    }
    tcg_gen_andi_i32_mips64el(s,ret,ret,1);
    tcg_gen_extu_i32_i64_mips64el(s,s->bcond,ret);
    uVar2 = 0x1800;
  }
  else {
    if ((int)op < 0x45400000) {
      if (op == 0x45200000) {
        ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
        pTVar3 = (TCGv_i32)((long)ts - (long)s);
        iVar4 = 0x17;
        if (cc != 0) {
          iVar4 = cc + 0x18;
        }
        tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
        arg1 = s->fpu_fcr31;
        iVar4 = cc + 0x19;
        goto LAB_009b1d35;
      }
      if (op != 0x45210000) goto LAB_009b193b;
      ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      iVar4 = 0x17;
      if (cc != 0) {
        iVar4 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
      tcg_gen_shri_i32_mips64el(s,(TCGv_i32)((long)ts - (long)s),s->fpu_fcr31,cc + 0x19);
      tcg_gen_op3_mips64el(s,INDEX_op_or_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
    }
    else {
      if (op != 0x45400000) {
        if (op == 0x45410000) {
          ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
          pTVar3 = (TCGv_i32)((long)ts - (long)s);
          iVar4 = 0x17;
          if (cc != 0) {
            iVar4 = cc + 0x18;
          }
          tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
          tcg_gen_shri_i32_mips64el(s,pTVar3,s->fpu_fcr31,cc + 0x19);
          tcg_gen_op3_mips64el(s,INDEX_op_or_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
          tcg_gen_shri_i32_mips64el(s,pTVar3,s->fpu_fcr31,cc + 0x1a);
          tcg_gen_op3_mips64el(s,INDEX_op_or_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
          tcg_gen_shri_i32_mips64el(s,pTVar3,s->fpu_fcr31,cc + 0x1b);
          tcg_gen_op3_mips64el(s,INDEX_op_or_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
          goto LAB_009b1d5a;
        }
        goto LAB_009b193b;
      }
      ts = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      pTVar3 = (TCGv_i32)((long)ts - (long)s);
      iVar4 = 0x17;
      if (cc != 0) {
        iVar4 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(s,ret,s->fpu_fcr31,iVar4);
      tcg_gen_shri_i32_mips64el(s,pTVar3,s->fpu_fcr31,cc + 0x19);
      tcg_gen_op3_mips64el(s,INDEX_op_and_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
      tcg_gen_shri_i32_mips64el(s,pTVar3,s->fpu_fcr31,cc + 0x1a);
      tcg_gen_op3_mips64el(s,INDEX_op_and_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
      arg1 = s->fpu_fcr31;
      iVar4 = cc + 0x1b;
LAB_009b1d35:
      tcg_gen_shri_i32_mips64el(s,pTVar3,arg1,iVar4);
      tcg_gen_nand_i32_mips64el(s,ret,ret,pTVar3);
    }
LAB_009b1d5a:
    tcg_temp_free_internal_mips64el(s,ts);
LAB_009b1d5f:
    tcg_gen_andi_i32_mips64el(s,ret,ret,1);
    tcg_gen_extu_i32_i64_mips64el(s,s->bcond,ret);
    uVar2 = 0x1000;
  }
  ctx->btarget = (long)offset + tVar1 + 4;
  ctx->hflags = uVar2 | ctx->hflags | 0x10000;
LAB_009b1dab:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_compute_branch1(DisasContext *ctx, uint32_t op,
                                int32_t cc, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btarget;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);

    if ((ctx->insn_flags & ISA_MIPS32R6) && (ctx->hflags & MIPS_HFLAG_BMASK)) {
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    if (cc != 0) {
        check_insn(ctx, ISA_MIPS4 | ISA_MIPS32);
    }

    btarget = ctx->base.pc_next + 4 + offset;

    switch (op) {
    case OPC_BC1F:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_not_i32(tcg_ctx, t0, t0);
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        goto not_likely;
    case OPC_BC1FL:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_not_i32(tcg_ctx, t0, t0);
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        goto likely;
    case OPC_BC1T:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        goto not_likely;
    case OPC_BC1TL:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
    likely:
        ctx->hflags |= MIPS_HFLAG_BL;
        break;
    case OPC_BC1FANY2:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_nand_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
        goto not_likely;
    case OPC_BC1TANY2:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
        goto not_likely;
    case OPC_BC1FANY4:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_and_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 2));
            tcg_gen_and_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 3));
            tcg_gen_nand_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
        goto not_likely;
    case OPC_BC1TANY4:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 2));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 3));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
    not_likely:
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    default:
        MIPS_INVAL("cp1 cond branch");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    ctx->btarget = btarget;
    ctx->hflags |= MIPS_HFLAG_BDS32;
 out:
    tcg_temp_free_i32(tcg_ctx, t0);
}